

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_>::SetIntegrationRule
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *this,int ord)

{
  int iVar1;
  TPZIntPoints *pTVar2;
  int64_t iVar3;
  TPZIntelGen<pzshape::TPZShapeQuad> *in_RDI;
  int intrulepoints;
  TPZIntPoints *intrule;
  
  TPZIntelGen<pzshape::TPZShapeQuad>::SetIntegrationRule
            ((TPZIntelGen<pzshape::TPZShapeQuad> *)intrule,intrulepoints);
  pTVar2 = TPZIntelGen<pzshape::TPZShapeQuad>::GetIntegrationRule(in_RDI);
  iVar1 = (*pTVar2->_vptr_TPZIntPoints[3])();
  iVar3 = TPZVec<long>::size((TPZVec<long> *)
                             &in_RDI[2].super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                              super_TPZCompEl.fIntegrationRule);
  if (iVar1 != iVar3) {
    (**(code **)(*(long *)&(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
                           super_TPZCompEl + 0x178))();
    (**(code **)(*(long *)&(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
                           super_TPZCompEl + 0x168))();
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetIntegrationRule(int ord)
{
    TBASE::SetIntegrationRule(ord);
    // verify if the number of integration points changed
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    int intrulepoints = intrule.NPoints();
    if (intrulepoints != fIntPtIndices.size()) {
        SetFreeIntPtIndices();
        PrepareIntPtIndices();
    }
    
}